

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImputerValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)601>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  FeatureDescription *pFVar3;
  void *pvVar4;
  long lVar5;
  bool bVar6;
  LogMessage *pLVar7;
  undefined8 *puVar8;
  long *plVar9;
  ArrayFeatureType *pAVar10;
  Imputer *pIVar11;
  DoubleVector *pDVar12;
  FeatureType *pFVar13;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ModelDescription *interface;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_02;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_03;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_04;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_05;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_06;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_07;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_08;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_09;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_10;
  anon_class_24_3_489072cd checkInterfaceCompatible;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  possible_types;
  allocator_type local_114;
  allocator_type local_113;
  less<CoreML::Specification::Imputer::ReplaceValueCase> local_112;
  allocator_type local_111;
  pointer local_110;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [8];
  _Alloc_hider _Stack_e0;
  undefined1 local_d8 [52];
  ReplaceValueCase local_a4;
  TypeCase local_a0 [2];
  _Rb_tree<CoreML::Specification::Imputer::ReplaceValueCase,_CoreML::Specification::Imputer::ReplaceValueCase,_std::_Identity<CoreML::Specification::Imputer::ReplaceValueCase>,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
  local_98;
  anon_class_24_3_489072cd local_60;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_48;
  
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Result::Result((Result *)&local_110);
  validateModelDescription((Result *)local_e8,interface,format->specificationversion_);
  local_110 = (pointer)local_e8;
  std::__cxx11::string::operator=((string *)&local_108,(string *)&_Stack_e0);
  pcVar2 = local_d8 + 8;
  if (_Stack_e0._M_p != pcVar2) {
    operator_delete(_Stack_e0._M_p,local_d8._8_8_ + 1);
  }
  bVar6 = Result::good((Result *)&local_110);
  if (!bVar6) {
    *(pointer *)__return_storage_ptr__ = local_110;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_p == &local_f8) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_f8._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_108._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_100;
    return __return_storage_ptr__;
  }
  local_e8 = (undefined1  [8])0x200000001;
  _Stack_e0._M_p = (pointer)0x300000005;
  local_d8._0_4_ = 6;
  __l._M_len = 5;
  __l._M_array = (iterator)local_e8;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector(&local_48,__l,(allocator_type *)&local_98);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_e8,(CoreML *)&interface->input_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_48,in_R8
            );
  local_110 = (pointer)local_e8;
  std::__cxx11::string::operator=((string *)&local_108,(string *)&_Stack_e0);
  if (_Stack_e0._M_p != pcVar2) {
    operator_delete(_Stack_e0._M_p,local_d8._8_8_ + 1);
  }
  bVar6 = Result::good((Result *)&local_110);
  if (!bVar6) goto switchD_004d91ad_default;
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_e8,(CoreML *)&interface->output_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_48,in_R8
            );
  local_110 = (pointer)local_e8;
  std::__cxx11::string::operator=((string *)&local_108,(string *)&_Stack_e0);
  if (_Stack_e0._M_p != pcVar2) {
    operator_delete(_Stack_e0._M_p,local_d8._8_8_ + 1);
  }
  bVar6 = Result::good((Result *)&local_110);
  if (!bVar6) goto switchD_004d91ad_default;
  if ((interface->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_e8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_e8);
  }
  pFVar3 = (FeatureDescription *)((interface->input_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if ((interface->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_e8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_e8);
  }
  pvVar4 = ((interface->output_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  puVar8 = *(undefined8 **)((long)pvVar4 + 0x20);
  if (puVar8 == (undefined8 *)0x0) {
    puVar8 = &Specification::_FeatureType_default_instance_;
  }
  pFVar13 = pFVar3->type_;
  if (pFVar13 == (FeatureType *)0x0) {
    pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
  }
  if (*(uint32 *)((long)puVar8 + 0x24) != pFVar13->_oneof_case_[0]) {
    local_e8 = (undefined1  [8])local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Type of input feature does not match the output type feature.",""
              );
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_e8);
LAB_004d90f0:
    if (local_e8 != (undefined1  [8])local_d8) {
      operator_delete((void *)local_e8,CONCAT44(local_d8._4_4_,local_d8._0_4_) + 1);
    }
    goto LAB_004d94d7;
  }
  if (*(uint32 *)((long)puVar8 + 0x24) == 5) {
    if ((((pFVar13->Type_).multiarraytype_)->shape_).current_size_ == 1) {
      if (*(int *)(puVar8[3] + 0x10) == 1) {
        plVar9 = google::protobuf::RepeatedField<long>::Get
                           (&((pFVar13->Type_).multiarraytype_)->shape_,0);
        puVar8 = *(undefined8 **)((long)pvVar4 + 0x20);
        if (puVar8 == (undefined8 *)0x0) {
          puVar8 = &Specification::_FeatureType_default_instance_;
        }
        lVar5 = *plVar9;
        if (*(int *)((long)puVar8 + 0x24) == 5) {
          pAVar10 = (ArrayFeatureType *)puVar8[3];
        }
        else {
          pAVar10 = Specification::ArrayFeatureType::default_instance();
        }
        plVar9 = google::protobuf::RepeatedField<long>::Get(&pAVar10->shape_,0);
        if (lVar5 == *plVar9) goto LAB_004d9161;
      }
      local_e8 = (undefined1  [8])local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,"Shape of output array does not match shape of input array.","")
      ;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_e8);
    }
    else {
      local_e8 = (undefined1  [8])local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,
                 "Only 1 dimensional arrays input features are supported by the imputer.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_e8);
    }
    goto LAB_004d90f0;
  }
LAB_004d9161:
  local_60.input = pFVar3;
  local_60.result = (Result *)&local_110;
  local_60.format = format;
  if (format->_oneof_case_[0] == 0x259) {
    pIVar11 = (format->Type_).imputer_;
  }
  else {
    pIVar11 = Specification::Imputer::default_instance();
  }
  switch(pIVar11->_oneof_case_[0]) {
  case 0:
    local_e8 = (undefined1  [8])local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Imputer parameter must be set.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_e8);
    goto LAB_004d90f0;
  case 1:
    local_a0[0] = kDoubleType;
    local_a0[1] = kMultiArrayType;
    __l_07._M_len = 2;
    __l_07._M_array = local_a0;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_e8,__l_07,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_114,
          &local_111);
    local_a4 = kReplaceDoubleValue;
    __l_08._M_len = 1;
    __l_08._M_array = &local_a4;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_98,__l_08,&local_112,&local_113);
    validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
              (&local_60,
               (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_e8,
               (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                *)&local_98);
    break;
  case 2:
    local_a0[0] = 1;
    __l_03._M_len = 1;
    __l_03._M_array = local_a0;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_e8,__l_03,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_114,
          &local_111);
    local_a4 = kReplaceInt64Value;
    __l_04._M_len = 1;
    __l_04._M_array = &local_a4;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_98,__l_04,&local_112,&local_113);
    validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
              (&local_60,
               (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_e8,
               (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                *)&local_98);
    break;
  case 3:
    local_a0[0] = 3;
    __l_05._M_len = 1;
    __l_05._M_array = local_a0;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_e8,__l_05,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_114,
          &local_111);
    local_a4 = kReplaceStringValue;
    __l_06._M_len = 1;
    __l_06._M_array = &local_a4;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_98,__l_06,&local_112,&local_113);
    validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
              (&local_60,
               (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_e8,
               (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                *)&local_98);
    break;
  case 4:
    local_a0[0] = 5;
    __l_01._M_len = 1;
    __l_01._M_array = local_a0;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_e8,__l_01,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_114,
          &local_111);
    local_a4 = kReplaceDoubleValue;
    __l_02._M_len = 1;
    __l_02._M_array = &local_a4;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_98,__l_02,&local_112,&local_113);
    bVar6 = validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
                      (&local_60,
                       (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                        *)local_e8,
                       (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                        *)&local_98);
    std::
    _Rb_tree<CoreML::Specification::Imputer::ReplaceValueCase,_CoreML::Specification::Imputer::ReplaceValueCase,_std::_Identity<CoreML::Specification::Imputer::ReplaceValueCase>,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::~_Rb_tree(&local_98);
    std::
    _Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Rb_tree((_Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                 *)local_e8);
    if (bVar6) {
      pFVar13 = pFVar3->type_;
      if (pFVar13 == (FeatureType *)0x0) {
        pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      if (pFVar13->_oneof_case_[0] == 5) {
        pAVar10 = (pFVar13->Type_).multiarraytype_;
      }
      else {
        pAVar10 = Specification::ArrayFeatureType::default_instance();
      }
      plVar9 = google::protobuf::RepeatedField<long>::Get(&pAVar10->shape_,0);
      lVar5 = *plVar9;
      if (pIVar11->_oneof_case_[0] == 4) {
        pDVar12 = (pIVar11->ImputedValue_).imputeddoublearray_;
      }
      else {
        pDVar12 = Specification::DoubleVector::default_instance();
      }
      if (lVar5 != (pDVar12->vector_).current_size_) {
        local_e8 = (undefined1  [8])local_d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e8,
                   "Shape of imputed array value does not match shape of input array.","");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_e8);
        goto LAB_004d90f0;
      }
    }
    goto switchD_004d91ad_default;
  case 5:
    local_a0[0] = 5;
    __l_09._M_len = 1;
    __l_09._M_array = local_a0;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_e8,__l_09,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_114,
          &local_111);
    local_a4 = kReplaceInt64Value;
    __l_10._M_len = 1;
    __l_10._M_array = &local_a4;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_98,__l_10,&local_112,&local_113);
    bVar6 = validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
                      (&local_60,
                       (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                        *)local_e8,
                       (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                        *)&local_98);
    std::
    _Rb_tree<CoreML::Specification::Imputer::ReplaceValueCase,_CoreML::Specification::Imputer::ReplaceValueCase,_std::_Identity<CoreML::Specification::Imputer::ReplaceValueCase>,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::~_Rb_tree(&local_98);
    std::
    _Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Rb_tree((_Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                 *)local_e8);
    if (bVar6) {
      pFVar13 = pFVar3->type_;
      if (pFVar13 == (FeatureType *)0x0) {
        pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      if (pFVar13->_oneof_case_[0] == 5) {
        pAVar10 = (pFVar13->Type_).multiarraytype_;
      }
      else {
        pAVar10 = Specification::ArrayFeatureType::default_instance();
      }
      plVar9 = google::protobuf::RepeatedField<long>::Get(&pAVar10->shape_,0);
      lVar5 = *plVar9;
      if (pIVar11->_oneof_case_[0] == 5) {
        pDVar12 = (pIVar11->ImputedValue_).imputeddoublearray_;
      }
      else {
        pDVar12 = (DoubleVector *)Specification::Int64Vector::default_instance();
      }
      if (lVar5 != (pDVar12->vector_).current_size_) {
        local_e8 = (undefined1  [8])local_d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e8,
                   "Shape of imputed array value does not match shape of input array.","");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_e8);
        goto LAB_004d90f0;
      }
    }
    goto switchD_004d91ad_default;
  case 6:
  case 7:
    local_a0[0] = 6;
    __l_00._M_len = 1;
    __l_00._M_array = local_a0;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_e8,__l_00,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_a4,
          &local_114);
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl._0_8_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
              (&local_60,
               (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_e8,
               (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                *)&local_98);
    break;
  default:
    goto switchD_004d91ad_default;
  }
  std::
  _Rb_tree<CoreML::Specification::Imputer::ReplaceValueCase,_CoreML::Specification::Imputer::ReplaceValueCase,_std::_Identity<CoreML::Specification::Imputer::ReplaceValueCase>,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
  ::~_Rb_tree(&local_98);
  std::
  _Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~_Rb_tree((_Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
               *)local_e8);
switchD_004d91ad_default:
  *(pointer *)__return_storage_ptr__ = local_110;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p == &local_f8) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_f8._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_108._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_100;
  local_100 = 0;
  local_f8._M_local_buf[0] = '\0';
  local_108._M_p = (pointer)&local_f8;
LAB_004d94d7:
  if (local_48.
      super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,
                    CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_imputer>(const Specification::Model& format) {
        const auto& description = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        // Convenience typedefs
        typedef Specification::FeatureType FT;
        typedef Specification::Imputer::ReplaceValueCase RVC;
        
        
        std::vector<Specification::FeatureType::TypeCase> possible_types = {
            FT::kInt64Type, FT::kDoubleType, FT::kMultiArrayType,
            FT::kStringType, FT::kDictionaryType};
        
        // Validate the inputs, though we'll have to do more of this manually.
        result = validateDescriptionsContainFeatureWithTypes(description.input(), 1, possible_types);
        
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(description.output(), 1, possible_types);
        
        if (!result.good()) {
            return result;
        }
        
            // From the above, we know that we have exactly one input and one output type.
        const auto& input = description.input()[0];
        const auto& output = description.output()[0];
        
        // make sure the input and the output match.
        if(output.type().Type_case() != input.type().Type_case()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Type of input feature does not match the output type feature.");
        }
        
        // If it's an array, we need to test sizes.
        if(input.type().Type_case() == FT::kMultiArrayType) {
            if(input.type().multiarraytype().shape_size() != 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                "Only 1 dimensional arrays input features are supported by the imputer.");
            }
            
            if(output.type().multiarraytype().shape_size() != 1
               || (input.type().multiarraytype().shape(0) != output.type().multiarraytype().shape(0))) {
                return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                                "Shape of output array does not match shape of input array.");
            }
        }
        
           
        // Input and output types are allowed based on the values present in the
        auto checkInterfaceCompatible =
        [&](const std::set<Specification::FeatureType::TypeCase>& compatibleFeatureTypes,
            const std::set<Specification::Imputer::ReplaceValueCase>& compatibleReplaceTypes) {
            
            if(!compatibleFeatureTypes.count(input.type().Type_case())) {
                result = Result(ResultType::INVALID_MODEL_PARAMETERS,
                       "Type of input feature \"" + input.name() + "\" is not compatible with given imputed value type.");
                return false;
            }
            
            
            // Check to make sure the the replace value is fine
            if(format.imputer().ReplaceValue_case() != Specification::Imputer::REPLACEVALUE_NOT_SET) {
                if(!compatibleReplaceTypes.count(format.imputer().ReplaceValue_case())) {
                    result = Result(ResultType::INVALID_MODEL_PARAMETERS,
                                    "Type of given replace value not compatible with input feature type.");
                    return false;
                }
            }
            
            // We're all okay now.
            return true;
        };
               
        // Validate the different combinations of stuff.
        const auto& imputer = format.imputer();
        switch (imputer.ImputedValue_case()) {
            case Specification::Imputer::kImputedDoubleValue:
                if(!checkInterfaceCompatible({FT::kDoubleType, FT::kMultiArrayType}, {RVC::kReplaceDoubleValue})) {
                        return result;
                    }
                break;
                
            case Specification::Imputer::kImputedInt64Value:
                if(!checkInterfaceCompatible({FT::kInt64Type}, {RVC::kReplaceInt64Value})) {
                        return result;
                    }
                break;
            case Specification::Imputer::kImputedDoubleArray:
                if(!checkInterfaceCompatible({FT::kMultiArrayType}, {RVC::kReplaceDoubleValue})) {
                    return result;
                }
                
                    // Check to make sure the array sizes match
                if(input.type().multiarraytype().shape(0) != static_cast<int64_t>(imputer.imputeddoublearray().vector_size())) {
                    return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                                   "Shape of imputed array value does not match shape of input array.");
                }
                
                break;
            case Specification::Imputer::kImputedStringValue:
                if(!checkInterfaceCompatible({FT::kStringType}, {RVC::kReplaceStringValue})) {
                    return result;
                }
                break;
                    
            case Specification::Imputer::kImputedInt64Array:
                if(!checkInterfaceCompatible({FT::kMultiArrayType}, {RVC::kReplaceInt64Value})) {
                    return result;
                }
                
                    // Check to make sure the array sizes match
                if(input.type().multiarraytype().shape(0) != static_cast<int64_t>(imputer.imputedint64array().vector_size())) {
                    return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                                   "Shape of imputed array value does not match shape of input array.");
                }
                break;
                    
            case Specification::Imputer::kImputedStringDictionary:
            case Specification::Imputer::kImputedInt64Dictionary:
                    // This only works with a full on ungiven replacement value.
                if(!checkInterfaceCompatible({FT::kDictionaryType}, {})) {
                    return result;
                }
                break;
                    
            case Specification::Imputer::IMPUTEDVALUE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Imputer parameter must be set.");
                break;
        }

        return result;
    }